

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O2

int jp2_bpcc_putdata(jp2_box_t *box,jas_stream_t *out)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 0;
  do {
    if ((box->data).ftyp.majver <= (ulong)uVar2) {
      return 0;
    }
    iVar1 = jp2_putuint8(out,(box->data).bpcc.bpcs[uVar2]);
    uVar2 = uVar2 + 1;
  } while (iVar1 == 0);
  return -1;
}

Assistant:

static int jp2_bpcc_putdata(jp2_box_t *box, jas_stream_t *out)
{
	jp2_bpcc_t *bpcc = &box->data.bpcc;
	unsigned int i;
	for (i = 0; i < bpcc->numcmpts; ++i) {
		if (jp2_putuint8(out, bpcc->bpcs[i])) {
			return -1;
		}
	}
	return 0;
}